

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbox_base.cpp
# Opt level: O2

void __thiscall
cppurses::detail::Textbox_base::Textbox_base(Textbox_base *this,Glyph_string *contents)

{
  less<int> local_29;
  vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_> local_28;
  
  std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::vector
            (&local_28,&contents->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>);
  Text_display::Text_display(&this->super_Text_display,(Glyph_string *)&local_28);
  std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::~vector(&local_28);
  (this->super_Text_display).super_Widget._vptr_Widget = (_func_int **)&PTR__Textbox_base_0017cfc8;
  std::
  make_shared<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>,sig::Optional_last_value<void>const&,std::less<int>const&>
            ((Optional_last_value<void> *)&this->cursor_moved_left,&local_29);
  std::
  make_shared<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>,sig::Optional_last_value<void>const&,std::less<int>const&>
            ((Optional_last_value<void> *)&this->cursor_moved_right,&local_29);
  std::
  make_shared<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>,sig::Optional_last_value<void>const&,std::less<int>const&>
            ((Optional_last_value<void> *)&this->cursor_moved_up,&local_29);
  std::
  make_shared<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>,sig::Optional_last_value<void>const&,std::less<int>const&>
            ((Optional_last_value<void> *)&this->cursor_moved_down,&local_29);
  (this->super_Text_display).super_Widget.cursor.enabled_ = true;
  return;
}

Assistant:

Textbox_base::Textbox_base(Glyph_string contents)
    : Text_display{std::move(contents)} {
    this->cursor.enable();
}